

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  int iVar1;
  unsigned_short *puVar2;
  int iVar3;
  undefined6 in_register_00000032;
  float fVar4;
  
  iVar3 = (int)CONCAT62(in_register_00000032,dst);
  iVar1 = (this->IndexLookup).Size;
  if (((iVar1 <= iVar3) || ((this->IndexLookup).Data[dst] != 0xffff || overwrite_dst)) &&
     ((int)(uint)src < iVar1 || iVar3 < iVar1)) {
    GrowIndex(this,iVar3 + 1);
    puVar2 = (this->IndexLookup).Data;
    if ((int)(uint)src < iVar1) {
      puVar2[dst] = puVar2[src];
      fVar4 = (this->IndexAdvanceX).Data[src];
    }
    else {
      puVar2[dst] = 0xffff;
      fVar4 = 1.0;
    }
    (this->IndexAdvanceX).Data[dst] = fVar4;
  }
  return;
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    int index_size = IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (ImWchar)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (ImWchar)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}